

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float16 float16_div_x86_64(float16 a,float16 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float16 fVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  FloatParts FVar12;
  FloatParts FVar13;
  
  FVar12 = float16_unpack_canonical(a,status);
  uVar10 = FVar12._8_8_;
  uVar9 = FVar12.frac;
  FVar13 = float16_unpack_canonical(b,status);
  uVar6 = FVar13._8_8_;
  uVar11 = FVar13.frac;
  uVar7 = (uVar6 ^ uVar10) & 0x10000000000;
  uVar8 = FVar12._12_4_ & 0xff;
  uVar4 = FVar13._12_4_ & 0xff;
  if ((uVar8 == 2) && (uVar4 == 2)) {
    uVar6 = (ulong)((FVar12.exp - FVar13.exp) - (uint)(uVar9 < uVar11));
    lVar5 = 0;
    if (uVar11 <= uVar9) {
      lVar5 = uVar9 << 0x3f;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar11 * 2;
    auVar2._8_8_ = uVar9 >> (uVar11 <= uVar9);
    auVar2._0_8_ = lVar5;
    uVar9 = (ulong)(SUB168(auVar2 % auVar1,0) != 0) | SUB168(auVar2 / auVar1,0);
    uVar10 = uVar10 & 0xffff00ff00000000;
  }
  else {
    if (((uVar10 | uVar6) & 0xfc00000000) != 0) {
      FVar13._8_8_ = uVar6 & 0xffffffffffff;
      FVar13.frac = uVar11;
      FVar12 = pick_nan(FVar12,FVar13,status);
      goto LAB_004a4483;
    }
    if (((uVar10 >> 0x20 & 1) != 0) && (uVar8 == uVar4)) {
      status->float_exception_flags = status->float_exception_flags | 1;
      FVar12.exp = 0x7fffffff;
      FVar12.cls = float_class_qnan;
      FVar12.sign = true;
      FVar12._14_2_ = 0;
      FVar12.frac = 0x2000000000000000;
      goto LAB_004a4483;
    }
    if ((uVar10 >> 0x20 & 1) != 0) {
      uVar7 = uVar7 | uVar10 & 0xffff0003ffffffff;
      FVar12.exp = (int)uVar7;
      FVar12.cls = (char)(uVar7 >> 0x20);
      FVar12.sign = (_Bool)(char)(uVar7 >> 0x28);
      FVar12._14_2_ = (short)(uVar7 >> 0x30);
      FVar12.frac = uVar9;
      goto LAB_004a4483;
    }
    if (uVar4 == 3) {
      uVar11 = uVar10 & 0xffff0000ffffffff | uVar7 | 0x100000000;
      FVar12.exp = (int)uVar11;
      FVar12.cls = (char)(uVar11 >> 0x20);
      FVar12.sign = (_Bool)(char)(uVar11 >> 0x28);
      FVar12._14_2_ = (short)(uVar11 >> 0x30);
      FVar12.frac = uVar9;
      goto LAB_004a4483;
    }
    if (uVar4 != 1) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0x702,(char *)0x0);
    }
    status->float_exception_flags = status->float_exception_flags | 4;
    uVar10 = uVar10 & 0xffff0000ffffffff;
    uVar6 = 0x300000000;
  }
  uVar7 = uVar6 | uVar10 | uVar7;
  FVar12.exp = (int)uVar7;
  FVar12.cls = (char)(uVar7 >> 0x20);
  FVar12.sign = (_Bool)(char)(uVar7 >> 0x28);
  FVar12._14_2_ = (short)(uVar7 >> 0x30);
  FVar12.frac = uVar9;
LAB_004a4483:
  fVar3 = float16_round_pack_canonical(FVar12,status);
  return fVar3;
}

Assistant:

float16 float16_div(float16 a, float16 b, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pr = div_floats(pa, pb, status);

    return float16_round_pack_canonical(pr, status);
}